

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpointer.h
# Opt level: O0

QPointer<QWidget> * __thiscall QPointer<QWidget>::operator=(QPointer<QWidget> *this,QWidget *p)

{
  QPointer<QWidget> *in_RDI;
  QObject *unaff_retaddr;
  
  QWeakPointer<QObject>::assign<QObject>((QWeakPointer<QObject> *)p,unaff_retaddr);
  return in_RDI;
}

Assistant:

inline QPointer<T> &operator=(T* p)
    { wp.assign(static_cast<QObjectType*>(p)); return *this; }